

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storefst.h
# Opt level: O3

bool __thiscall PDA::Transducer::StoreFst::step(StoreFst *this)

{
  pointer pwVar1;
  pointer pRVar2;
  long lVar3;
  long lVar4;
  long *plVar5;
  bool bVar6;
  int iVar7;
  Settings *pSVar8;
  wostream *pwVar9;
  long lVar10;
  wchar_t *local_38;
  long local_30;
  long local_28 [2];
  
  if ((this->m_currentState).m_sourcePosition <
      (int)((ulong)((long)(this->m_tokens).
                          super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->m_tokens).
                         super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x33333333) {
    pwVar1 = (this->m_currentState).m_stack.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((this->m_currentState).m_stack.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl
        .super__Vector_impl_data._M_start != pwVar1) {
      iVar7 = iswupper(pwVar1[-1]);
      if (iVar7 != 0) {
        if ((this->m_currentState).m_ruleIndex == -1) {
          iVar7 = findRule(this,(this->m_currentState).m_stack.
                                super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
                                super__Vector_impl_data._M_finish[-1]);
          (this->m_currentState).m_ruleIndex = iVar7;
          (this->m_currentState).m_chainIndex = -1;
          if (iVar7 == -1) {
            pSVar8 = Utils::Settings::Instance();
            bVar6 = Utils::Settings::isSyntaxTraceEnabled(pSVar8);
            if (bVar6) {
              *(undefined8 *)(wmemcmp + *(long *)(std::wcerr + -0x18)) = 10;
              std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                        ((wostream *)&std::wcerr,L"Error: no rule found(",0x15);
              local_38._0_4_ =
                   (this->m_currentState).m_stack.
                   super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1];
              pwVar9 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                 ((wostream *)&std::wcerr,(wchar_t *)&local_38,1);
              local_38 = (wchar_t *)CONCAT44(local_38._4_4_,0x29);
              pwVar9 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                 (pwVar9,(wchar_t *)&local_38,1);
              std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar9);
            }
            local_38 = (wchar_t *)local_28;
            std::__cxx11::wstring::_M_construct<wchar_t_const*>
                      ((wstring *)&local_38,L"Grammar error, no rule",L"");
            raise(this,(int)&local_38);
          }
        }
        pSVar8 = Utils::Settings::Instance();
        bVar6 = Utils::Settings::isSyntaxTraceEnabled(pSVar8);
        if (bVar6) {
          *(undefined8 *)(std::locale::global + *(long *)(std::wcout + -0x18)) = 10;
          std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>((wostream *)&std::wcout,L"NT ",3)
          ;
          local_38 = (wchar_t *)
                     CONCAT44(local_38._4_4_,
                              (this->m_currentState).m_stack.
                              super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
                              super__Vector_impl_data._M_finish[-1]);
          pwVar9 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                             ((wostream *)&std::wcout,(wchar_t *)&local_38,1);
          std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar9,L"[",1);
          pwVar9 = (wostream *)
                   std::wostream::operator<<
                             ((wostream *)pwVar9,(this->m_currentState).m_chainIndex + 1);
          std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar9,L"]-> ",4);
          lVar10 = (long)(this->m_currentState).m_chainIndex + 1;
          iVar7 = (this->m_currentState).m_ruleIndex;
          pRVar2 = (this->m_grammar).m_rules.
                   super__Vector_base<PDA::Transducer::Grammar::Rule,_std::allocator<PDA::Transducer::Grammar::Rule>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar3 = *(long *)&pRVar2[iVar7].m_chains.
                            super__Vector_base<PDA::Transducer::Grammar::Chain,_std::allocator<PDA::Transducer::Grammar::Chain>_>
          ;
          if ((int)lVar10 <
              (int)((ulong)((long)*(pointer *)
                                   ((long)&pRVar2[iVar7].m_chains.
                                           super__Vector_base<PDA::Transducer::Grammar::Chain,_std::allocator<PDA::Transducer::Grammar::Chain>_>
                                   + 8) - lVar3) >> 5)) {
            lVar10 = lVar10 * 0x20;
            local_38 = (wchar_t *)local_28;
            lVar4 = *(long *)(lVar3 + lVar10);
            std::__cxx11::wstring::_M_construct<wchar_t*>
                      ((wstring *)&local_38,lVar4,lVar4 + *(long *)(lVar3 + 8 + lVar10) * 4);
          }
          else {
            local_38 = (wchar_t *)local_28;
            std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_38,L"<EMPTY>",L"")
            ;
          }
          pwVar9 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                             (pwVar9,local_38,local_30);
          plVar5 = *(long **)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0xf0);
          if (plVar5 == (long *)0x0) {
            std::__throw_bad_cast();
          }
          (**(code **)(*plVar5 + 0x50))(plVar5,10);
          std::wostream::put((wchar_t)pwVar9);
          std::wostream::flush();
          if (local_38 != (wchar_t *)local_28) {
            operator_delete(local_38,local_28[0] * 4 + 4);
          }
        }
        std::
        deque<PDA::Transducer::StoreFst::State,_std::allocator<PDA::Transducer::StoreFst::State>_>::
        push_back(&(this->m_states).c,&this->m_currentState);
        expandCurrentNTerminal(this);
        goto LAB_0012b62e;
      }
      pwVar1 = (this->m_currentState).m_stack.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      iVar7 = (this->m_currentState).m_sourcePosition;
      if (pwVar1[-1] ==
          (this->m_tokens).
          super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
          _M_impl.super__Vector_impl_data._M_start[iVar7].token) {
        (this->m_currentState).m_sourcePosition = iVar7 + 1;
        (this->m_currentState).m_stack.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl
        .super__Vector_impl_data._M_finish = pwVar1 + -1;
        goto LAB_0012b62e;
      }
    }
  }
  else {
    pSVar8 = Utils::Settings::Instance();
    bVar6 = Utils::Settings::isSyntaxTraceEnabled(pSVar8);
    if (bVar6) {
      *(undefined8 *)(std::locale::global + *(long *)(std::wcout + -0x18)) = 10;
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                ((wostream *)&std::wcout,L"Source empty",0xc);
      plVar5 = *(long **)(std::__cxx11::wstring::operator= + *(long *)(std::wcout + -0x18));
      if (plVar5 == (long *)0x0) goto LAB_0012b642;
      (**(code **)(*plVar5 + 0x50))(plVar5,10);
      std::wostream::put(L'\x00150230');
      std::wostream::flush();
    }
    if ((this->m_currentState).m_stack.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl
        .super__Vector_impl_data._M_start ==
        (this->m_currentState).m_stack.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      pSVar8 = Utils::Settings::Instance();
      bVar6 = Utils::Settings::isSyntaxTraceEnabled(pSVar8);
      if (bVar6) {
        *(undefined8 *)(std::locale::global + *(long *)(std::wcout + -0x18)) = 10;
        std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                  ((wostream *)&std::wcout,L"Parsing complete",0x10);
        plVar5 = *(long **)(std::__cxx11::wstring::operator= + *(long *)(std::wcout + -0x18));
        if (plVar5 == (long *)0x0) {
LAB_0012b642:
          std::__throw_bad_cast();
        }
        (**(code **)(*plVar5 + 0x50))(plVar5,10);
        std::wostream::put(L'\x00150230');
        std::wostream::flush();
      }
      return false;
    }
    if ((this->m_states).c.
        super__Deque_base<PDA::Transducer::StoreFst::State,_std::allocator<PDA::Transducer::StoreFst::State>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        (this->m_states).c.
        super__Deque_base<PDA::Transducer::StoreFst::State,_std::allocator<PDA::Transducer::StoreFst::State>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      local_38 = (wchar_t *)local_28;
      std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_38,L"mismatch",L"");
      raise(this,(int)&local_38);
    }
  }
  rollback(this);
LAB_0012b62e:
  debugLine(this);
  return true;
}

Assistant:

bool step()
    {
        if (m_currentState.m_sourcePosition < static_cast<int>(m_tokens.size()))
        {
            if (!m_currentState.m_stack.empty())
            {
                if (!isTerminalOnTop())
                {
                    if (m_currentState.m_ruleIndex == -1)
                    {
                        m_currentState.m_ruleIndex = findRule(m_currentState.m_stack.back());
                        m_currentState.m_chainIndex = -1;
                    }
                    if (m_currentState.m_ruleIndex == -1)
                    {
                        if (Utils::Settings::Instance().isSyntaxTraceEnabled())
                            std::wcerr << std::setw(10) << L"Error: no rule found(" << m_currentState.m_stack.back() << L')' << std::endl;
                        raise(L"Grammar error, no rule");
                    }
                    if (Utils::Settings::Instance().isSyntaxTraceEnabled())
                        std::wcout << std::setw(10) << L"NT " << m_currentState.m_stack.back() << L"[" << m_currentState.m_chainIndex + 1 << L"]-> "
                                   << ((m_currentState.m_chainIndex + 1 < static_cast<int>(m_grammar.rules()[static_cast<size_t>(m_currentState.m_ruleIndex)].m_chains.size())) ?
                                    m_grammar.rules()[static_cast<size_t>(m_currentState.m_ruleIndex)].m_chains[static_cast<size_t>(m_currentState.m_chainIndex + 1)].m_chain : L"<EMPTY>") << std::endl;

                    m_states.push(m_currentState);
                    expandCurrentNTerminal();
                }
                else
                {
                    if (m_currentState.m_stack.back() == m_tokens[static_cast<size_t>(m_currentState.m_sourcePosition)].token)
                    {
                        ++m_currentState.m_sourcePosition;
                        m_currentState.m_stack.pop_back();
                    }
                    else
                    {
                        rollback();
                    }
                }
            }
            else // Store empty
            {

                rollback();
            }
        }
        else // End of source
        {
            if (Utils::Settings::Instance().isSyntaxTraceEnabled())
                std::wcout << std::setw(10) << L"Source empty" << std::endl;
            if (m_currentState.m_stack.empty())
            {
                if (Utils::Settings::Instance().isSyntaxTraceEnabled())
                    std::wcout << std::setw(10) << L"Parsing complete" << std::endl;
                return false;
            }
            else
            {
                if (m_states.empty())
                    raise(L"mismatch");
                else
                    rollback();
            }
        }
        debugLine();
        return true;
    }